

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalGhsMultiGenerator::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalGhsMultiGenerator *this,string *makeProgram,
          string *projectName,string *projectDir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targetNames,string *param_5,int jobs,bool verbose,cmBuildOptions *param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference __lhs;
  ulong uVar4;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  allocator<cmGlobalGenerator::GeneratedMakeCommand> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_238;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string all;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tname;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_198 [6];
  bool build_all;
  undefined1 local_178 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_140 [8];
  string proj;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  GeneratedMakeCommand makeCommand;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targetNames_local;
  string *projectDir_local;
  string *projectName_local;
  string *makeProgram_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  makeCommand.super_GeneratedMakeCommand._31_1_ = verbose;
  cmGlobalGenerator::GeneratedMakeCommand::GeneratedMakeCommand((GeneratedMakeCommand *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  cmGlobalGenerator::SelectMakeProgram
            (&local_80,&this->super_cmGlobalGenerator,makeProgram,&local_a0);
  detail::GeneratedMakeCommand::Add<std::__cxx11::string>
            ((GeneratedMakeCommand *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (jobs != -1) {
    if (jobs == 0) {
      detail::GeneratedMakeCommand::Add<char_const(&)[10]>
                ((GeneratedMakeCommand *)local_60,(char (*) [10])"-parallel");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"-parallel=",&local_f9)
      ;
      std::__cxx11::to_string((string *)((long)&proj.field_2 + 8),jobs);
      std::operator+(&local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&proj.field_2 + 8));
      detail::GeneratedMakeCommand::Add<std::__cxx11::string>
                ((GeneratedMakeCommand *)local_60,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)(proj.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,projectName,".top");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,FILE_EXTENSION);
  std::__cxx11::string::~string
            ((string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,".*\\.top\\.gpj",(allocator<char> *)((long)&__range2 + 7));
  cmSystemTools::Glob(projectDir,(string *)local_198,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
  std::__cxx11::string::~string((string *)local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178);
  if (!bVar1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178,0);
    std::__cxx11::string::operator=((string *)local_140,(string *)pvVar3);
  }
  detail::GeneratedMakeCommand::Add<char_const(&)[5],std::__cxx11::string&>
            ((GeneratedMakeCommand *)local_60,(char (*) [5])"-top",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  __range2._6_1_ = 0;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(targetNames);
  if (bVar1) {
    __range2._6_1_ = 1;
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(targetNames);
    tname = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(targetNames);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&tname), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        bVar1 = std::operator==(__lhs,"clean");
        if (bVar1) {
          detail::GeneratedMakeCommand::Add<char_const(&)[7]>
                    ((GeneratedMakeCommand *)local_60,(char (*) [7])"-clean");
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&all.field_2 + 8),__lhs,".tgt.gpj");
          detail::GeneratedMakeCommand::Add<std::__cxx11::string>
                    ((GeneratedMakeCommand *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&all.field_2 + 8));
          std::__cxx11::string::~string((string *)(all.field_2._M_local_buf + 8));
        }
      }
      else {
        __range2._6_1_ = 1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  if ((__range2._6_1_ & 1) != 0) {
    iVar2 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x19])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,(char *)CONCAT44(extraout_var,iVar2),&local_221);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   &local_220,".tgt.gpj");
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    detail::GeneratedMakeCommand::Add<std::__cxx11::string&>
              ((GeneratedMakeCommand *)local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    std::__cxx11::string::~string((string *)local_200);
  }
  if ((makeCommand.super_GeneratedMakeCommand._31_1_ & 1) != 0) {
    detail::GeneratedMakeCommand::Add<char_const(&)[10]>
              ((GeneratedMakeCommand *)local_60,(char (*) [10])0xc4f341);
  }
  local_238._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(makeOptions);
  local_238._M_allocated_capacity =
       (size_type)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(makeOptions);
  detail::GeneratedMakeCommand::Add
            ((GeneratedMakeCommand *)local_60,(const_iterator)local_238._8_8_,
             (const_iterator)local_238._M_allocated_capacity);
  cmGlobalGenerator::GeneratedMakeCommand::GeneratedMakeCommand
            ((GeneratedMakeCommand *)&local_268,(GeneratedMakeCommand *)local_60);
  local_240 = 1;
  local_248 = &local_268;
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::allocator(&local_269);
  __l._M_len = local_240;
  __l._M_array = (iterator)local_248;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(__return_storage_ptr__,__l,&local_269);
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::~allocator(&local_269);
  local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248;
  do {
    local_2e8 = local_2e8 + -1;
    cmGlobalGenerator::GeneratedMakeCommand::~GeneratedMakeCommand
              ((GeneratedMakeCommand *)local_2e8);
  } while (local_2e8 != &local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  std::__cxx11::string::~string((string *)local_140);
  cmGlobalGenerator::GeneratedMakeCommand::~GeneratedMakeCommand((GeneratedMakeCommand *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalGhsMultiGenerator::GenerateBuildCommand(
  const std::string& makeProgram, const std::string& projectName,
  const std::string& projectDir, std::vector<std::string> const& targetNames,
  const std::string& /*config*/, int jobs, bool verbose,
  const cmBuildOptions& /*buildOptions*/,
  std::vector<std::string> const& makeOptions)
{
  GeneratedMakeCommand makeCommand;

  makeCommand.Add(this->SelectMakeProgram(makeProgram));

  if (jobs != cmake::NO_BUILD_PARALLEL_LEVEL) {
    if (jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL) {
      makeCommand.Add("-parallel");
    } else {
      makeCommand.Add(std::string("-parallel=") + std::to_string(jobs));
    }
  }

  /* determine the top-project file in the project directory */
  std::string proj = projectName + ".top" + FILE_EXTENSION;
  std::vector<std::string> files;
  cmSystemTools::Glob(projectDir, ".*\\.top\\.gpj", files);
  if (!files.empty()) {
    /* use the real top-level project in the directory */
    proj = files.at(0);
  }
  makeCommand.Add("-top", proj);

  /* determine targets to build */
  bool build_all = false;
  if (!targetNames.empty()) {
    for (const auto& tname : targetNames) {
      if (!tname.empty()) {
        if (tname == "clean") {
          makeCommand.Add("-clean");
        } else {
          makeCommand.Add(tname + ".tgt.gpj");
        }
      } else {
        build_all = true;
      }
    }
  } else {
    build_all = true;
  }

  if (build_all) {
    /* transform name to default build */;
    std::string all = std::string(this->GetAllTargetName()) + ".tgt.gpj";
    makeCommand.Add(all);
  }

  if (verbose) {
    makeCommand.Add("-commands");
  }
  makeCommand.Add(makeOptions.begin(), makeOptions.end());

  return { std::move(makeCommand) };
}